

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O2

void __thiscall
wasm::BinaryenIRWriter<wasm::StackIRGenerator>::visitPossibleBlockContents
          (BinaryenIRWriter<wasm::StackIRGenerator> *this,Expression *curr)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  Expression *curr_00;
  bool bVar2;
  Expression **ppEVar3;
  char *in_RCX;
  Name target;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  if ((curr->_id == BlockId) &&
     (target.super_IString.str._M_str = in_RCX, target.super_IString.str._M_len = curr[1].type.id,
     bVar2 = BranchUtils::BranchSeeker::has((BranchSeeker *)curr,*(Expression **)(curr + 1),target),
     !bVar2)) {
    __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar1 = (ArenaVector<wasm::Expression_*> *)curr[2].type.id;
    local_40 = (undefined1  [8])(curr + 2);
    while ((__begin2.parent != pAVar1 || (local_40 != (undefined1  [8])(curr + 2)))) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_40);
      curr_00 = *ppEVar3;
      visit(this,curr_00);
      if ((curr_00->type).id == 1) {
        return;
      }
      __begin2.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin2.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    return;
  }
  visit(this,curr);
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitPossibleBlockContents(Expression* curr) {
  auto* block = curr->dynCast<Block>();
  // Even if the block has a name, check if the name is necessary (if it has no
  // uses, it is equivalent to not having one). Scanning the children of the
  // block means that this takes quadratic time, but it will be N^2 for a fairly
  // small N since the number of nested non-block control flow structures tends
  // to be very reasonable.
  if (!block || BranchUtils::BranchSeeker::has(block, block->name)) {
    visit(curr);
    return;
  }
  for (auto* child : block->list) {
    visit(child);
    // Since this child was unreachable, either this child or one of its
    // descendants was a source of unreachability that was actually
    // emitted. Subsequent children won't be reachable, so skip them.
    if (child->type == Type::unreachable) {
      break;
    }
  }
}